

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

RPCHelpMan * getmininginfo(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  bool bVar1;
  RPCHelpMan *in_RDI;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffff228;
  vector<RPCResult,_std::allocator<RPCResult>_> *this;
  allocator<RPCResult> *this_00;
  RPCResult *this_01;
  anon_class_1_0_00000001 *in_stack_fffffffffffff230;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff260;
  allocator<char> *in_stack_fffffffffffff268;
  char *in_stack_fffffffffffff270;
  undefined7 in_stack_fffffffffffff278;
  undefined1 in_stack_fffffffffffff27f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff280;
  string *in_stack_fffffffffffff288;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff290;
  undefined1 *puVar3;
  string *in_stack_fffffffffffff298;
  RPCResult *in_stack_fffffffffffff2a0;
  RPCMethodImpl *pRVar4;
  RPCResult *in_stack_fffffffffffff2a8;
  RPCMethodImpl *pRVar5;
  RPCResult *in_stack_fffffffffffff2b0;
  RPCExamples *examples;
  pointer *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_02;
  bool local_ba9;
  bool local_ba6;
  undefined1 local_b40 [35];
  allocator<char> local_b1d;
  allocator<char> local_b1c;
  allocator<char> local_b1b [3];
  pointer local_b18;
  pointer pRStack_b10;
  pointer local_b08;
  allocator<char> local_afa;
  allocator<char> local_af9 [31];
  allocator<char> local_ada;
  allocator<char> local_ad9;
  _Alloc_hider local_ad8;
  size_type sStack_ad0;
  undefined1 local_ac8 [14];
  allocator<char> local_aba;
  allocator<char> local_ab9;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  allocator<char> local_a9a;
  allocator<char> local_a99;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined1 local_a7a;
  undefined1 local_a79 [9];
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined1 local_a5a [2];
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  allocator<char> local_a3a;
  allocator<char> local_a39;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  allocator<char> local_a1a;
  allocator<char> local_a19;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  allocator<char> local_9fa;
  allocator<char> local_9f9;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  allocator<char> local_9d2;
  allocator<char> local_9d1 [31];
  allocator<char> local_9b2;
  allocator<char> local_9b1 [25];
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  allocator<char> local_97a;
  allocator<char> local_979 [321];
  undefined1 local_838 [136];
  undefined1 local_7b0 [608];
  RPCMethodImpl local_550 [17];
  RPCHelpMan local_330 [2];
  RPCMethodImpl local_110 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  local_998 = 0;
  uStack_990 = 0;
  local_988 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  local_9f8 = 0;
  uStack_9f0 = 0;
  local_9e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff228);
  RPCResult::RPCResult
            (in_stack_fffffffffffff2b0,(Type)((ulong)in_stack_fffffffffffff2a8 >> 0x20),
             (string *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290
             ,SUB81((ulong)in_stack_fffffffffffff288 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  local_a18 = 0;
  uStack_a10 = 0;
  local_a08 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff228);
  this = (vector<RPCResult,_std::allocator<RPCResult>_> *)
         ((ulong)in_stack_fffffffffffff228 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_fffffffffffff2a8,(Type)((ulong)in_stack_fffffffffffff2a0 >> 0x20),
             in_stack_fffffffffffff298,SUB81((ulong)in_stack_fffffffffffff290 >> 0x38,0),
             in_stack_fffffffffffff288,in_stack_fffffffffffff280,(bool)in_stack_fffffffffffff27f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  local_a38 = 0;
  uStack_a30 = 0;
  local_a28 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  this_00 = (allocator<RPCResult> *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_fffffffffffff2a8,(Type)((ulong)in_stack_fffffffffffff2a0 >> 0x20),
             in_stack_fffffffffffff298,SUB81((ulong)in_stack_fffffffffffff290 >> 0x38,0),
             in_stack_fffffffffffff288,in_stack_fffffffffffff280,(bool)in_stack_fffffffffffff27f);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff288 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  local_a58 = 0;
  uStack_a50 = 0;
  local_a48 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
  RPCResult::RPCResult
            (in_stack_fffffffffffff2b0,(Type)((ulong)in_stack_fffffffffffff2a8 >> 0x20),
             (string *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290
             ,(bool)skip_type_check);
  this_02 = local_330;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  name = (string *)local_a5a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  local_a79._1_8_ = 0;
  uStack_a70 = 0;
  local_a68 = 0;
  description = (string *)(local_a79 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
  RPCResult::RPCResult
            (in_stack_fffffffffffff2b0,(Type)((ulong)in_stack_fffffffffffff2a8 >> 0x20),
             (string *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290
             ,(bool)skip_type_check);
  results = (pointer *)
            ((long)&local_330[0].m_results.m_results.
                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data + 0x10);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)local_a79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  examples = (RPCExamples *)&local_a7a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  local_a98 = 0;
  uStack_a90 = 0;
  local_a88 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
  RPCResult::RPCResult
            (in_stack_fffffffffffff2b0,(Type)((ulong)in_stack_fffffffffffff2a8 >> 0x20),
             (string *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290
             ,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  local_ab8 = 0;
  uStack_ab0 = 0;
  local_aa8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
  RPCResult::RPCResult
            (in_stack_fffffffffffff2b0,(Type)((ulong)in_stack_fffffffffffff2a8 >> 0x20),
             (string *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290
             ,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  bVar1 = IsDeprecatedRPCEnabled
                    ((string *)CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
               in_stack_fffffffffffff270,in_stack_fffffffffffff268);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
               in_stack_fffffffffffff270,in_stack_fffffffffffff268);
    local_ad8._M_p = (pointer)0x0;
    sStack_ad0 = 0;
    local_ac8._0_8_ = 0;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
    RPCResult::RPCResult
              (in_stack_fffffffffffff2b0,(Type)((ulong)in_stack_fffffffffffff2a8 >> 0x20),
               (string *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
               in_stack_fffffffffffff290,(bool)skip_type_check);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
               in_stack_fffffffffffff270,in_stack_fffffffffffff268);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
               in_stack_fffffffffffff270,in_stack_fffffffffffff268);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
               in_stack_fffffffffffff270,in_stack_fffffffffffff268);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
               in_stack_fffffffffffff270,in_stack_fffffffffffff268);
    local_b18 = (pointer)0x0;
    pRStack_b10 = (pointer)0x0;
    local_b08 = (pointer)0x0;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
    RPCResult::RPCResult
              (in_stack_fffffffffffff2b0,(Type)((ulong)in_stack_fffffffffffff2a8 >> 0x20),
               (string *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
               in_stack_fffffffffffff290,(bool)skip_type_check);
    std::allocator<RPCResult>::allocator(this_00);
    __l._M_len._0_7_ = in_stack_fffffffffffff278;
    __l._M_array = (iterator)in_stack_fffffffffffff270;
    __l._M_len._7_1_ = in_stack_fffffffffffff27f;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff268,__l,
               (allocator_type *)in_stack_fffffffffffff260);
    RPCResult::RPCResult
              (in_stack_fffffffffffff2b0,(Type)((ulong)in_stack_fffffffffffff2a8 >> 0x20),
               (string *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
               in_stack_fffffffffffff290,(bool)skip_type_check);
  }
  local_ba9 = !bVar1;
  pRVar5 = local_550;
  std::allocator<RPCResult>::allocator(this_00);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff278;
  __l_00._M_array = (iterator)in_stack_fffffffffffff270;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff27f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff268,__l_00,
             (allocator_type *)in_stack_fffffffffffff260);
  RPCResult::RPCResult
            (in_stack_fffffffffffff2b0,(Type)((ulong)in_stack_fffffffffffff2a8 >> 0x20),
             (string *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290
             ,(bool)skip_type_check);
  RPCResults::RPCResults((RPCResults *)in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  HelpExampleCli(in_stack_fffffffffffff260,in_stack_fffffffffffff258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),in_stack_fffffffffffff270
             ,in_stack_fffffffffffff268);
  HelpExampleRpc(in_stack_fffffffffffff260,in_stack_fffffffffffff258);
  std::operator+(in_stack_fffffffffffff260,in_stack_fffffffffffff258);
  RPCExamples::RPCExamples((RPCExamples *)this_00,(string *)0x60cd1d);
  this_01 = (RPCResult *)local_b40;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getmininginfo()::__0,void>(in_stack_fffffffffffff238,in_stack_fffffffffffff230);
  RPCHelpMan::RPCHelpMan(this_02,name,description,args,(RPCResults *)results,examples,pRVar5);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_01);
  RPCExamples::~RPCExamples((RPCExamples *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)(local_b40 + 0x22));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_b1d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_b1c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(local_b1b);
  RPCResults::~RPCResults((RPCResults *)this_01);
  RPCResult::~RPCResult(this_01);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff238);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  pRVar5 = local_550;
  pRVar4 = local_110;
  do {
    pRVar4 = (RPCMethodImpl *)&pRVar4[-5]._M_invoker;
    RPCResult::~RPCResult(this_01);
  } while (pRVar4 != pRVar5);
  if (local_ba9) {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff238);
    std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
    puVar3 = local_838;
    puVar2 = local_7b0;
    do {
      puVar2 = puVar2 + -0x88;
      RPCResult::~RPCResult(this_01);
    } while (puVar2 != puVar3);
  }
  if (bVar1) {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff238);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::allocator<char>::~allocator((allocator<char> *)(local_ac8 + 0xd));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::allocator<char>::~allocator(&local_aba);
  }
  else {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff238);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::allocator<char>::~allocator(&local_afa);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::allocator<char>::~allocator(local_af9);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::allocator<char>::~allocator(&local_ada);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::allocator<char>::~allocator(&local_ad9);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_ab9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_a9a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_a99);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)&local_a7a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)local_a79);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)local_a5a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)(local_a5a + 1));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_a3a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_a39);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_a1a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_a19);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_9fa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_9f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_9d2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(local_9d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_9b2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(local_9b1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff238);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_97a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(local_979);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getmininginfo()
{
    return RPCHelpMan{"getmininginfo",
                "\nReturns a json object containing mining-related information.",
                {},
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::NUM, "blocks", "The current block"},
                        {RPCResult::Type::NUM, "currentblockweight", /*optional=*/true, "The block weight of the last assembled block (only present if a block was ever assembled)"},
                        {RPCResult::Type::NUM, "currentblocktx", /*optional=*/true, "The number of block transactions of the last assembled block (only present if a block was ever assembled)"},
                        {RPCResult::Type::NUM, "difficulty", "The current difficulty"},
                        {RPCResult::Type::NUM, "networkhashps", "The network hashes per second"},
                        {RPCResult::Type::NUM, "pooledtx", "The size of the mempool"},
                        {RPCResult::Type::STR, "chain", "current network name (" LIST_CHAIN_NAMES ")"},
                        (IsDeprecatedRPCEnabled("warnings") ?
                            RPCResult{RPCResult::Type::STR, "warnings", "any network and blockchain warnings (DEPRECATED)"} :
                            RPCResult{RPCResult::Type::ARR, "warnings", "any network and blockchain warnings (run with `-deprecatedrpc=warnings` to return the latest warning as a single string)",
                            {
                                {RPCResult::Type::STR, "", "warning"},
                            }
                            }
                        ),
                    }},
                RPCExamples{
                    HelpExampleCli("getmininginfo", "")
            + HelpExampleRpc("getmininginfo", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CTxMemPool& mempool = EnsureMemPool(node);
    ChainstateManager& chainman = EnsureChainman(node);
    LOCK(cs_main);
    const CChain& active_chain = chainman.ActiveChain();

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("blocks",           active_chain.Height());
    if (BlockAssembler::m_last_block_weight) obj.pushKV("currentblockweight", *BlockAssembler::m_last_block_weight);
    if (BlockAssembler::m_last_block_num_txs) obj.pushKV("currentblocktx", *BlockAssembler::m_last_block_num_txs);
    obj.pushKV("difficulty", GetDifficulty(*CHECK_NONFATAL(active_chain.Tip())));
    obj.pushKV("networkhashps",    getnetworkhashps().HandleRequest(request));
    obj.pushKV("pooledtx",         (uint64_t)mempool.size());
    obj.pushKV("chain", chainman.GetParams().GetChainTypeString());
    obj.pushKV("warnings", node::GetWarningsForRpc(*CHECK_NONFATAL(node.warnings), IsDeprecatedRPCEnabled("warnings")));
    return obj;
},
    };
}